

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O1

void __thiscall ALCcontext::allocVoices(ALCcontext *this,size_t addcount)

{
  vector<VoiceCluster> *this_00;
  __pointer_type ptr;
  pointer puVar1;
  __pointer_type pFVar2;
  undefined8 *puVar3;
  pointer puVar4;
  runtime_error *this_01;
  anon_union_8_2_dde17770_for_FlexArray<Voice_*,_8UL>_3 *paVar5;
  pointer *__ptr;
  _Head_base<0UL,_Voice_*,_false> size;
  index_type iVar6;
  long lVar7;
  Voice *pVVar8;
  ulong uVar9;
  _Head_base<0UL,_Voice_*,_false> local_48;
  __pointer_type local_40;
  ALCcontext *local_38;
  
  uVar9 = addcount + 0x1f >> 5;
  lVar7 = (long)(this->mVoiceClusters).
                super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mVoiceClusters).
                super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_38 = this;
  if (uVar9 < 0x3ffffffU - lVar7) {
    lVar7 = lVar7 + uVar9;
    iVar6 = lVar7 * 0x20;
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Increasing allocated voices to %zu\n",iVar6);
    }
    pVVar8 = (Voice *)(lVar7 * 0x100 | 8);
    size._M_head_impl = (Voice *)0x10;
    if ((Voice *)0x10 < pVVar8) {
      size._M_head_impl = pVVar8;
    }
    pFVar2 = (__pointer_type)al_calloc(8,(size_t)size._M_head_impl);
    if (pFVar2 == (__pointer_type)0x0) {
      pFVar2 = (__pointer_type)0x0;
    }
    else {
      pFVar2->mSize = iVar6;
    }
    if (0x1f < addcount + 0x1f) {
      this_00 = &local_38->mVoiceClusters;
      local_40 = pFVar2;
      do {
        puVar3 = (undefined8 *)Voice::operator_new((Voice *)0x5308,(size_t)size._M_head_impl);
        *puVar3 = 0x20;
        lVar7 = 0;
        pVVar8 = (Voice *)(puVar3 + 1);
        do {
          memset(pVVar8,0,0x298);
          Voice::Voice(pVVar8);
          lVar7 = lVar7 + -0x298;
          pVVar8 = pVVar8 + 1;
        } while (lVar7 != -0x5300);
        local_48._M_head_impl = (Voice *)(puVar3 + 1);
        std::
        vector<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,al::allocator<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,8ul>>
        ::emplace_back<std::unique_ptr<Voice[],std::default_delete<Voice[]>>>
                  ((vector<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,al::allocator<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,8ul>>
                    *)this_00,(unique_ptr<Voice[],_std::default_delete<Voice[]>_> *)&local_48);
        pFVar2 = local_40;
        size._M_head_impl = local_48._M_head_impl;
        if (local_48._M_head_impl != (Voice *)0x0) {
          std::default_delete<Voice[]>::operator()
                    ((default_delete<Voice[]> *)&local_48,local_48._M_head_impl);
        }
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    puVar4 = (local_38->mVoiceClusters).
             super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (local_38->mVoiceClusters).
             super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar1) {
      paVar5 = &pFVar2->field_1;
      do {
        lVar7 = 0;
        do {
          paVar5->mArray[0] =
               (element_type)
               ((long)&(((puVar4->_M_t).super___uniq_ptr_impl<Voice,_std::default_delete<Voice[]>_>.
                         _M_t.super__Tuple_impl<0UL,_Voice_*,_std::default_delete<Voice[]>_>.
                         super__Head_base<0UL,_Voice_*,_false>._M_head_impl)->mProps).Position +
               lVar7 + 0xffffffffffffffd0U);
          paVar5 = paVar5 + 1;
          lVar7 = lVar7 + 0x298;
        } while (lVar7 != 0x5300);
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar1);
    }
    LOCK();
    ptr = (local_38->mVoices)._M_b._M_p;
    (local_38->mVoices)._M_b._M_p = pFVar2;
    UNLOCK();
    if (ptr != (__pointer_type)0x0) {
      do {
      } while (((((local_38->mDevice).mPtr)->MixCount).super___atomic_base<unsigned_int>._M_i & 1)
               != 0);
      al_free(ptr);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Allocating too many voices");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ALCcontext::allocVoices(size_t addcount)
{
    constexpr size_t clustersize{32};
    /* Convert element count to cluster count. */
    addcount = (addcount+(clustersize-1)) / clustersize;

    if(addcount >= std::numeric_limits<int>::max()/clustersize - mVoiceClusters.size())
        throw std::runtime_error{"Allocating too many voices"};
    const size_t totalcount{(mVoiceClusters.size()+addcount) * clustersize};
    TRACE("Increasing allocated voices to %zu\n", totalcount);

    auto newarray = VoiceArray::Create(totalcount);
    while(addcount)
    {
        mVoiceClusters.emplace_back(std::make_unique<Voice[]>(clustersize));
        --addcount;
    }

    auto voice_iter = newarray->begin();
    for(VoiceCluster &cluster : mVoiceClusters)
    {
        for(size_t i{0};i < clustersize;++i)
            *(voice_iter++) = &cluster[i];
    }

    if(auto *oldvoices = mVoices.exchange(newarray.release(), std::memory_order_acq_rel))
    {
        mDevice->waitForMix();
        delete oldvoices;
    }
}